

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

MoveMapOwner __thiscall
gl4cts::BufferStorage::Buffer::MapRange
          (Buffer *this,GLintptr offset,GLsizeiptr length,GLenum access)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  void *data_;
  void *data;
  Functions *gl;
  GLenum access_local;
  GLsizeiptr length_local;
  GLintptr offset_local;
  Buffer *this_local;
  MoveMapOwner map;
  
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  Bind((Functions *)CONCAT44(extraout_var,iVar1),this->m_id,this->m_target);
  data_ = MapRange((Functions *)CONCAT44(extraout_var,iVar1),this->m_target,offset,length,access);
  MoveMapOwner::MoveMapOwner((MoveMapOwner *)&this_local,this,data_);
  return _this_local;
}

Assistant:

Buffer::MoveMapOwner Buffer::MapRange(glw::GLintptr offset, glw::GLsizeiptr length, glw::GLenum access)
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	Bind(gl, m_id, m_target);

	void* data = MapRange(gl, m_target, offset, length, access);

	MoveMapOwner map(this, data);

	return map;
}